

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack8.h
# Opt level: O0

void ncnn::deconvolution_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  long *plVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  int iVar75;
  int iVar76;
  undefined8 *puVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _w7;
  __m256 _w6;
  __m256 _w5;
  __m256 _w4;
  __m256 _w3;
  __m256 _w2;
  __m256 _w1;
  __m256 _w0;
  __m256 _val7;
  __m256 _val6;
  __m256 _val5;
  __m256 _val4;
  __m256 _val3;
  __m256 _val2;
  __m256 _val1;
  __m256 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_4;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  __m256 y_3;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  int local_48b0;
  int local_48a4;
  int local_4854;
  long local_4808;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  int local_47cc;
  int local_47c8;
  undefined1 (*local_4758) [32];
  int local_474c;
  float local_3f20;
  float fStack_3f1c;
  float fStack_3f18;
  float fStack_3f14;
  float fStack_3f10;
  float fStack_3f0c;
  float fStack_3f08;
  float fStack_3f04;
  undefined1 local_3e20 [8];
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  ulong uStack_3df8;
  float local_3d80;
  float fStack_3d7c;
  float fStack_3d78;
  float fStack_3d74;
  float fStack_3d70;
  float fStack_3d6c;
  float fStack_3d68;
  float local_3d40;
  float fStack_3d3c;
  float fStack_3d38;
  float fStack_3d34;
  float fStack_3d30;
  float fStack_3d2c;
  float fStack_3d28;
  float local_3d00;
  float fStack_3cfc;
  float fStack_3cf8;
  float fStack_3cf4;
  float fStack_3cf0;
  float fStack_3cec;
  float fStack_3ce8;
  float local_3cc0;
  float fStack_3cbc;
  float fStack_3cb8;
  float fStack_3cb4;
  float fStack_3cb0;
  float fStack_3cac;
  float fStack_3ca8;
  float local_3c80;
  float fStack_3c7c;
  float fStack_3c78;
  float fStack_3c74;
  float fStack_3c70;
  float fStack_3c6c;
  float fStack_3c68;
  float local_3c40;
  float fStack_3c3c;
  float fStack_3c38;
  float fStack_3c34;
  float fStack_3c30;
  float fStack_3c2c;
  float fStack_3c28;
  float local_3c00;
  float fStack_3bfc;
  float fStack_3bf8;
  float fStack_3bf4;
  float fStack_3bf0;
  float fStack_3bec;
  float fStack_3be8;
  float local_3bc0;
  float fStack_3bbc;
  float fStack_3bb8;
  float fStack_3bb4;
  float fStack_3bb0;
  float fStack_3bac;
  float fStack_3ba8;
  float local_3a20;
  float fStack_3a1c;
  float fStack_3a18;
  float fStack_3a14;
  float fStack_3a10;
  float fStack_3a0c;
  float fStack_3a08;
  float fStack_3a04;
  float local_3a00;
  float fStack_39fc;
  float fStack_39f8;
  float fStack_39f4;
  float fStack_39f0;
  float fStack_39ec;
  float fStack_39e8;
  float local_39e0;
  float fStack_39dc;
  float fStack_39d8;
  float fStack_39d4;
  float fStack_39d0;
  float fStack_39cc;
  float fStack_39c8;
  float fStack_39c4;
  ulong uStack_3898;
  float local_3860;
  float fStack_385c;
  float fStack_3858;
  float fStack_3854;
  float fStack_3850;
  float fStack_384c;
  float fStack_3848;
  float fStack_3844;
  float local_3800;
  float fStack_37fc;
  float fStack_37f8;
  float fStack_37f4;
  float fStack_37f0;
  float fStack_37ec;
  float fStack_37e8;
  float fStack_37e4;
  float local_37c0;
  float fStack_37bc;
  float fStack_37b8;
  float fStack_37b4;
  float fStack_37b0;
  float fStack_37ac;
  float fStack_37a8;
  float local_37a0;
  float fStack_379c;
  float fStack_3798;
  float fStack_3794;
  float fStack_3790;
  float fStack_378c;
  float fStack_3788;
  undefined4 uStack_3784;
  undefined1 local_3740 [8];
  float fStack_3738;
  float fStack_3734;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  float local_36a0;
  float fStack_369c;
  float fStack_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  float fStack_3688;
  float fStack_3684;
  float local_3660;
  float fStack_365c;
  float fStack_3658;
  float fStack_3654;
  float fStack_3650;
  float fStack_364c;
  float fStack_3648;
  float fStack_3644;
  float local_3600;
  float fStack_35fc;
  float fStack_35f8;
  float fStack_35f4;
  float fStack_35f0;
  float fStack_35ec;
  float fStack_35e8;
  undefined4 uStack_35e4;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined1 local_3260 [8];
  float fStack_3258;
  float fStack_3254;
  float fStack_3250;
  float fStack_324c;
  float fStack_3248;
  undefined4 uStack_3244;
  undefined1 local_3220 [16];
  float local_2ee0;
  float fStack_2edc;
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  float local_2d40;
  float fStack_2d3c;
  float fStack_2d38;
  float fStack_2d34;
  float fStack_2d30;
  float fStack_2d2c;
  float fStack_2d28;
  float local_2ce0;
  float fStack_2cdc;
  float fStack_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  float fStack_2cc8;
  float fStack_2cc4;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined1 local_2ba0 [8];
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  undefined4 uStack_2b84;
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  float local_2360;
  float fStack_235c;
  float fStack_2358;
  float fStack_2354;
  float fStack_2350;
  float fStack_234c;
  float fStack_2348;
  float fStack_2344;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float fStack_2204;
  float local_1c40;
  float fStack_1c3c;
  float fStack_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float fStack_1c28;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float local_1c00;
  float fStack_1bfc;
  float fStack_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float fStack_1bec;
  float fStack_1be8;
  undefined4 uStack_1be4;
  float local_1b40;
  float fStack_1b3c;
  float fStack_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  float fStack_1b28;
  float fStack_1b24;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined1 local_1960 [8];
  float fStack_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float fStack_1948;
  undefined4 uStack_1944;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined1 local_e80 [8];
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  undefined1 local_e00 [8];
  float fStack_df8;
  float fStack_df4;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined1 local_d80 [8];
  float fStack_d78;
  float fStack_d74;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined8 local_160;
  undefined8 uStack_158;
  
  lVar71 = in_RSI[7];
  lVar13 = *in_RCX;
  for (local_474c = 0; local_474c < (int)lVar71; local_474c = local_474c + 1) {
    local_4758 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_474c * in_RSI[2]);
    iVar11 = *(int *)((long)in_RDI + 0x2c);
    lVar72 = in_RDI[6];
    lVar73 = in_RDI[7];
    iVar12 = *(int *)((long)in_RSI + 0x2c);
    lVar74 = in_RSI[6];
    for (local_47c8 = 0; local_47c8 < (int)lVar74; local_47c8 = local_47c8 + 1) {
      for (local_47cc = 0; local_47cc < iVar12; local_47cc = local_47cc + 1) {
        local_4800 = 0;
        uStack_47f8 = 0;
        uStack_47f0 = 0;
        uStack_47e8 = 0;
        if (lVar13 != 0) {
          puVar77 = (undefined8 *)(lVar13 + (long)(local_474c << 3) * 4);
          local_4800 = *puVar77;
          uStack_47f8 = puVar77[1];
          uStack_47f0 = puVar77[2];
          uStack_47e8 = puVar77[3];
        }
        local_4808 = *in_RDX + in_RDX[8] * (long)local_474c * in_RDX[2];
        for (local_4854 = 0; local_4854 < (int)lVar73; local_4854 = local_4854 + 1) {
          for (local_48a4 = 0; local_48a4 < in_R9D; local_48a4 = local_48a4 + 1) {
            iVar75 = (local_47c8 + local_48a4 * dilation_w) - dilation_w * (in_R9D + -1);
            if (((-1 < iVar75) && (iVar75 % stride_w == 0)) && (iVar75 / stride_w < (int)lVar72)) {
              for (local_48b0 = 0; local_48b0 < in_R8D; local_48b0 = local_48b0 + 1) {
                iVar76 = (local_47cc + local_48b0 * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar76) && (iVar76 % dilation_h == 0)) && (iVar76 / dilation_h < iVar11))
                {
                  pfVar1 = (float *)(*in_RDI + in_RDI[8] * (long)local_4854 * in_RDI[2] +
                                     (long)*(int *)((long)in_RDI + 0x2c) * (long)(iVar75 / stride_w)
                                     * in_RDI[2] + (long)(iVar76 / dilation_h << 3) * 4);
                  iVar76 = (local_48a4 * in_R8D + local_48b0) * 0x40;
                  fVar2 = *pfVar1;
                  fVar3 = pfVar1[1];
                  fVar4 = pfVar1[2];
                  fVar5 = pfVar1[3];
                  fVar6 = pfVar1[4];
                  fVar7 = pfVar1[5];
                  fVar8 = pfVar1[6];
                  fVar9 = pfVar1[7];
                  puVar77 = (undefined8 *)(local_4808 + (long)iVar76 * 4);
                  lVar78 = local_4808 + (long)iVar76 * 4;
                  lVar79 = local_4808 + (long)iVar76 * 4;
                  lVar80 = local_4808 + (long)iVar76 * 4;
                  lVar81 = local_4808 + (long)iVar76 * 4;
                  lVar82 = local_4808 + (long)iVar76 * 4;
                  lVar83 = local_4808 + (long)iVar76 * 4;
                  lVar84 = local_4808 + (long)iVar76 * 4;
                  local_3d80 = (float)*puVar77;
                  fStack_3d7c = (float)((ulong)*puVar77 >> 0x20);
                  fStack_3d78 = (float)puVar77[1];
                  fStack_3d74 = (float)((ulong)puVar77[1] >> 0x20);
                  fStack_3d70 = (float)puVar77[2];
                  fStack_3d6c = (float)((ulong)puVar77[2] >> 0x20);
                  fStack_3d68 = (float)puVar77[3];
                  local_3f20 = (float)local_4800;
                  fStack_3f1c = (float)((ulong)local_4800 >> 0x20);
                  fStack_3f18 = (float)uStack_47f8;
                  fStack_3f14 = (float)((ulong)uStack_47f8 >> 0x20);
                  fStack_3f10 = (float)uStack_47f0;
                  fStack_3f0c = (float)((ulong)uStack_47f0 >> 0x20);
                  fStack_3f08 = (float)uStack_47e8;
                  fStack_3f04 = (float)((ulong)uStack_47e8 >> 0x20);
                  local_3d40 = (float)*(undefined8 *)(lVar78 + 0x20);
                  fStack_3d3c = (float)((ulong)*(undefined8 *)(lVar78 + 0x20) >> 0x20);
                  fStack_3d38 = (float)*(undefined8 *)(lVar78 + 0x28);
                  fStack_3d34 = (float)((ulong)*(undefined8 *)(lVar78 + 0x28) >> 0x20);
                  fStack_3d30 = (float)*(undefined8 *)(lVar78 + 0x30);
                  fStack_3d2c = (float)((ulong)*(undefined8 *)(lVar78 + 0x30) >> 0x20);
                  fStack_3d28 = (float)*(undefined8 *)(lVar78 + 0x38);
                  local_3d00 = (float)*(undefined8 *)(lVar79 + 0x40);
                  fStack_3cfc = (float)((ulong)*(undefined8 *)(lVar79 + 0x40) >> 0x20);
                  fStack_3cf8 = (float)*(undefined8 *)(lVar79 + 0x48);
                  fStack_3cf4 = (float)((ulong)*(undefined8 *)(lVar79 + 0x48) >> 0x20);
                  fStack_3cf0 = (float)*(undefined8 *)(lVar79 + 0x50);
                  fStack_3cec = (float)((ulong)*(undefined8 *)(lVar79 + 0x50) >> 0x20);
                  fStack_3ce8 = (float)*(undefined8 *)(lVar79 + 0x58);
                  local_3cc0 = (float)*(undefined8 *)(lVar80 + 0x60);
                  fStack_3cbc = (float)((ulong)*(undefined8 *)(lVar80 + 0x60) >> 0x20);
                  fStack_3cb8 = (float)*(undefined8 *)(lVar80 + 0x68);
                  fStack_3cb4 = (float)((ulong)*(undefined8 *)(lVar80 + 0x68) >> 0x20);
                  fStack_3cb0 = (float)*(undefined8 *)(lVar80 + 0x70);
                  fStack_3cac = (float)((ulong)*(undefined8 *)(lVar80 + 0x70) >> 0x20);
                  fStack_3ca8 = (float)*(undefined8 *)(lVar80 + 0x78);
                  local_3c80 = (float)*(undefined8 *)(lVar81 + 0x80);
                  fStack_3c7c = (float)((ulong)*(undefined8 *)(lVar81 + 0x80) >> 0x20);
                  fStack_3c78 = (float)*(undefined8 *)(lVar81 + 0x88);
                  fStack_3c74 = (float)((ulong)*(undefined8 *)(lVar81 + 0x88) >> 0x20);
                  fStack_3c70 = (float)*(undefined8 *)(lVar81 + 0x90);
                  fStack_3c6c = (float)((ulong)*(undefined8 *)(lVar81 + 0x90) >> 0x20);
                  fStack_3c68 = (float)*(undefined8 *)(lVar81 + 0x98);
                  local_3c40 = (float)*(undefined8 *)(lVar82 + 0xa0);
                  fStack_3c3c = (float)((ulong)*(undefined8 *)(lVar82 + 0xa0) >> 0x20);
                  fStack_3c38 = (float)*(undefined8 *)(lVar82 + 0xa8);
                  fStack_3c34 = (float)((ulong)*(undefined8 *)(lVar82 + 0xa8) >> 0x20);
                  fStack_3c30 = (float)*(undefined8 *)(lVar82 + 0xb0);
                  fStack_3c2c = (float)((ulong)*(undefined8 *)(lVar82 + 0xb0) >> 0x20);
                  fStack_3c28 = (float)*(undefined8 *)(lVar82 + 0xb8);
                  local_3c00 = (float)*(undefined8 *)(lVar83 + 0xc0);
                  fStack_3bfc = (float)((ulong)*(undefined8 *)(lVar83 + 0xc0) >> 0x20);
                  fStack_3bf8 = (float)*(undefined8 *)(lVar83 + 200);
                  fStack_3bf4 = (float)((ulong)*(undefined8 *)(lVar83 + 200) >> 0x20);
                  fStack_3bf0 = (float)*(undefined8 *)(lVar83 + 0xd0);
                  fStack_3bec = (float)((ulong)*(undefined8 *)(lVar83 + 0xd0) >> 0x20);
                  fStack_3be8 = (float)*(undefined8 *)(lVar83 + 0xd8);
                  local_3bc0 = (float)*(undefined8 *)(lVar84 + 0xe0);
                  fStack_3bbc = (float)((ulong)*(undefined8 *)(lVar84 + 0xe0) >> 0x20);
                  fStack_3bb8 = (float)*(undefined8 *)(lVar84 + 0xe8);
                  fStack_3bb4 = (float)((ulong)*(undefined8 *)(lVar84 + 0xe8) >> 0x20);
                  fStack_3bb0 = (float)*(undefined8 *)(lVar84 + 0xf0);
                  fStack_3bac = (float)((ulong)*(undefined8 *)(lVar84 + 0xf0) >> 0x20);
                  fStack_3ba8 = (float)*(undefined8 *)(lVar84 + 0xf8);
                  local_4800 = CONCAT44(fVar9 * fStack_3bbc +
                                        fVar8 * fStack_3bfc +
                                        fVar7 * fStack_3c3c +
                                        fVar6 * fStack_3c7c +
                                        fVar5 * fStack_3cbc +
                                        fVar4 * fStack_3cfc +
                                        fVar3 * fStack_3d3c + fVar2 * fStack_3d7c + fStack_3f1c,
                                        fVar9 * local_3bc0 +
                                        fVar8 * local_3c00 +
                                        fVar7 * local_3c40 +
                                        fVar6 * local_3c80 +
                                        fVar5 * local_3cc0 +
                                        fVar4 * local_3d00 +
                                        fVar3 * local_3d40 + fVar2 * local_3d80 + local_3f20);
                  uStack_47f8 = CONCAT44(fVar9 * fStack_3bb4 +
                                         fVar8 * fStack_3bf4 +
                                         fVar7 * fStack_3c34 +
                                         fVar6 * fStack_3c74 +
                                         fVar5 * fStack_3cb4 +
                                         fVar4 * fStack_3cf4 +
                                         fVar3 * fStack_3d34 + fVar2 * fStack_3d74 + fStack_3f14,
                                         fVar9 * fStack_3bb8 +
                                         fVar8 * fStack_3bf8 +
                                         fVar7 * fStack_3c38 +
                                         fVar6 * fStack_3c78 +
                                         fVar5 * fStack_3cb8 +
                                         fVar4 * fStack_3cf8 +
                                         fVar3 * fStack_3d38 + fVar2 * fStack_3d78 + fStack_3f18);
                  uStack_47f0 = CONCAT44(fVar9 * fStack_3bac +
                                         fVar8 * fStack_3bec +
                                         fVar7 * fStack_3c2c +
                                         fVar6 * fStack_3c6c +
                                         fVar5 * fStack_3cac +
                                         fVar4 * fStack_3cec +
                                         fVar3 * fStack_3d2c + fVar2 * fStack_3d6c + fStack_3f0c,
                                         fVar9 * fStack_3bb0 +
                                         fVar8 * fStack_3bf0 +
                                         fVar7 * fStack_3c30 +
                                         fVar6 * fStack_3c70 +
                                         fVar5 * fStack_3cb0 +
                                         fVar4 * fStack_3cf0 +
                                         fVar3 * fStack_3d30 + fVar2 * fStack_3d70 + fStack_3f10);
                  uStack_47e8 = CONCAT44(fVar9 + fVar8 + fVar7 + fVar6 + fVar5 + fVar4 + fVar3 + 
                                                  fVar2 + fStack_3f04,
                                         fVar9 * fStack_3ba8 +
                                         fVar8 * fStack_3be8 +
                                         fVar7 * fStack_3c28 +
                                         fVar6 * fStack_3c68 +
                                         fVar5 * fStack_3ca8 +
                                         fVar4 * fStack_3ce8 +
                                         fVar3 * fStack_3d28 + fVar2 * fStack_3d68 + fStack_3f08);
                }
              }
            }
          }
          local_4808 = local_4808 + (long)(in_R8D * in_R9D * 0x40) * 4;
        }
        plVar24 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_37a0 = (float)local_4800;
        fStack_379c = (float)((ulong)local_4800 >> 0x20);
        fStack_3798 = (float)uStack_47f8;
        fStack_3794 = (float)((ulong)uStack_47f8 >> 0x20);
        fStack_3790 = (float)uStack_47f0;
        fStack_378c = (float)((ulong)uStack_47f0 >> 0x20);
        fStack_3788 = (float)uStack_47e8;
        switch(stride_h) {
        case 1:
          uStack_3df8 = SUB328(ZEXT832(0),4);
          auVar25._8_8_ = uStack_47f8;
          auVar25._0_8_ = local_4800;
          auVar25._16_8_ = uStack_47f0;
          auVar25._24_8_ = uStack_47e8;
          _local_3e20 = vmaxps_avx(auVar25,ZEXT832(uStack_3df8) << 0x40);
          break;
        case 2:
          uVar10 = *(uint *)*plVar24;
          auVar28._8_8_ = uStack_47f8;
          auVar28._0_8_ = local_4800;
          auVar28._16_8_ = uStack_47f0;
          auVar28._24_8_ = uStack_47e8;
          auVar21 = vmaxps_avx(ZEXT832(0),auVar28);
          auVar29._8_8_ = uStack_47f8;
          auVar29._0_8_ = local_4800;
          auVar29._16_8_ = uStack_47f0;
          auVar29._24_8_ = uStack_47e8;
          auVar20 = vminps_avx(ZEXT832(0),auVar29);
          auVar14 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x30);
          auVar15 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x30);
          local_39e0 = auVar15._0_4_;
          fStack_39dc = auVar15._4_4_;
          fStack_39d8 = auVar15._8_4_;
          fStack_39d4 = auVar15._12_4_;
          fStack_39d0 = auVar14._0_4_;
          fStack_39cc = auVar14._4_4_;
          fStack_39c8 = auVar14._8_4_;
          fStack_39c4 = auVar14._12_4_;
          local_3a00 = auVar20._0_4_;
          fStack_39fc = auVar20._4_4_;
          fStack_39f8 = auVar20._8_4_;
          fStack_39f4 = auVar20._12_4_;
          fStack_39f0 = auVar20._16_4_;
          fStack_39ec = auVar20._20_4_;
          fStack_39e8 = auVar20._24_4_;
          local_3a20 = auVar21._0_4_;
          fStack_3a1c = auVar21._4_4_;
          fStack_3a18 = auVar21._8_4_;
          fStack_3a14 = auVar21._12_4_;
          fStack_3a10 = auVar21._16_4_;
          fStack_3a0c = auVar21._20_4_;
          fStack_3a08 = auVar21._24_4_;
          fStack_3a04 = auVar21._28_4_;
          local_3e20._4_4_ = fStack_3a1c + fStack_39dc * fStack_39fc;
          local_3e20._0_4_ = local_3a20 + local_39e0 * local_3a00;
          uStack_3e18._0_4_ = fStack_3a18 + fStack_39d8 * fStack_39f8;
          uStack_3e18._4_4_ = fStack_3a14 + fStack_39d4 * fStack_39f4;
          uStack_3e10._0_4_ = fStack_3a10 + fStack_39d0 * fStack_39f0;
          uStack_3e10._4_4_ = fStack_3a0c + fStack_39cc * fStack_39ec;
          uStack_3e08._0_4_ = fStack_3a08 + fStack_39c8 * fStack_39e8;
          uStack_3e08._4_4_ = fStack_3a04 + fStack_39c4;
          break;
        case 3:
          uVar10 = *(uint *)*plVar24;
          auVar14 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x30);
          auVar15 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x30);
          uStack_33f0 = auVar15._0_8_;
          uStack_33e8 = auVar15._8_8_;
          uVar10 = *(uint *)(*plVar24 + 4);
          auVar15 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x30);
          auVar16 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(uVar10),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(uVar10),0x30);
          uStack_33b0 = auVar15._0_8_;
          uStack_33a8 = auVar15._8_8_;
          auVar27._8_8_ = uStack_47f8;
          auVar27._0_8_ = local_4800;
          auVar27._16_8_ = uStack_47f0;
          auVar27._24_8_ = uStack_47e8;
          auVar26._16_8_ = uStack_33f0;
          auVar26._0_16_ = auVar14;
          auVar26._24_8_ = uStack_33e8;
          auVar21 = vmaxps_avx(auVar27,auVar26);
          auVar30._16_8_ = uStack_33b0;
          auVar30._0_16_ = auVar16;
          auVar30._24_8_ = uStack_33a8;
          _local_3e20 = vminps_avx(auVar21,auVar30);
          break;
        case 4:
          auVar14 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x30);
          auVar15 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x30);
          uStack_34b0 = auVar15._0_8_;
          uStack_34a8 = auVar15._8_8_;
          uStack_3898 = SUB328(ZEXT832(0),4);
          auVar36._8_8_ = uStack_47f8;
          auVar36._0_8_ = local_4800;
          auVar36._16_8_ = uStack_47f0;
          auVar36._24_8_ = uStack_47e8;
          auVar21 = vsubps_avx(ZEXT832(uStack_3898) << 0x40,auVar36);
          auVar35._8_8_ = 0x42b0c0a542b0c0a5;
          auVar35._0_8_ = 0x42b0c0a542b0c0a5;
          auVar35._16_8_ = 0x42b0c0a542b0c0a5;
          auVar35._24_8_ = 0x42b0c0a542b0c0a5;
          auVar21 = vminps_avx(auVar21,auVar35);
          auVar34._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar34._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar34._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar34._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar20 = vmaxps_avx(auVar21,auVar34);
          local_2820 = auVar20._0_4_;
          fStack_281c = auVar20._4_4_;
          fStack_2818 = auVar20._8_4_;
          fStack_2814 = auVar20._12_4_;
          fStack_2810 = auVar20._16_4_;
          fStack_280c = auVar20._20_4_;
          fStack_2808 = auVar20._24_4_;
          local_2ba0._4_4_ = fStack_281c * 1.442695 + 0.5;
          local_2ba0._0_4_ = local_2820 * 1.442695 + 0.5;
          fStack_2b98 = fStack_2818 * 1.442695 + 0.5;
          fStack_2b94 = fStack_2814 * 1.442695 + 0.5;
          fStack_2b90 = fStack_2810 * 1.442695 + 0.5;
          fStack_2b8c = fStack_280c * 1.442695 + 0.5;
          fStack_2b88 = fStack_2808 * 1.442695 + 0.5;
          uStack_2b84 = 0x3ff8aa3b;
          auVar23 = vroundps_avx(_local_2ba0,1);
          auVar21 = vcmpps_avx(_local_2ba0,auVar23,1);
          auVar37._8_8_ = 0x3f8000003f800000;
          auVar37._0_8_ = 0x3f8000003f800000;
          auVar37._16_8_ = 0x3f8000003f800000;
          auVar37._24_8_ = 0x3f8000003f800000;
          auVar21 = vandps_avx(auVar21,auVar37);
          auVar21 = vsubps_avx(auVar23,auVar21);
          local_2360 = auVar21._0_4_;
          fStack_235c = auVar21._4_4_;
          fStack_2358 = auVar21._8_4_;
          fStack_2354 = auVar21._12_4_;
          fStack_2350 = auVar21._16_4_;
          fStack_234c = auVar21._20_4_;
          fStack_2348 = auVar21._24_4_;
          fStack_2344 = auVar21._28_4_;
          auVar40._4_4_ = fStack_235c * 0.6933594;
          auVar40._0_4_ = local_2360 * 0.6933594;
          auVar40._8_4_ = fStack_2358 * 0.6933594;
          auVar40._12_4_ = fStack_2354 * 0.6933594;
          auVar40._16_4_ = fStack_2350 * 0.6933594;
          auVar40._20_4_ = fStack_234c * 0.6933594;
          auVar40._24_4_ = fStack_2348 * 0.6933594;
          auVar40._28_4_ = fStack_2344;
          auVar21 = vsubps_avx(auVar20,auVar40);
          auVar39._4_4_ = fStack_235c * -0.00021219444;
          auVar39._0_4_ = local_2360 * -0.00021219444;
          auVar39._8_4_ = fStack_2358 * -0.00021219444;
          auVar39._12_4_ = fStack_2354 * -0.00021219444;
          auVar39._16_4_ = fStack_2350 * -0.00021219444;
          auVar39._20_4_ = fStack_234c * -0.00021219444;
          auVar39._24_4_ = fStack_2348 * -0.00021219444;
          auVar39._28_4_ = fStack_2344;
          auVar21 = vsubps_avx(auVar21,auVar39);
          local_2620 = auVar21._0_4_;
          fStack_261c = auVar21._4_4_;
          fStack_2618 = auVar21._8_4_;
          fStack_2614 = auVar21._12_4_;
          fStack_2610 = auVar21._16_4_;
          fStack_260c = auVar21._20_4_;
          fStack_2608 = auVar21._24_4_;
          fStack_2604 = auVar21._28_4_;
          local_2bc0 = CONCAT44((int)fStack_235c,(int)local_2360);
          uStack_2bb8 = CONCAT44((int)fStack_2354,(int)fStack_2358);
          uStack_2bb0 = CONCAT44((int)fStack_234c,(int)fStack_2350);
          uStack_2ba8 = CONCAT44((int)fStack_2344,(int)fStack_2348);
          auVar46._8_8_ = uStack_2bb8;
          auVar46._0_8_ = local_2bc0;
          auVar45._8_8_ = 0x7f0000007f;
          auVar45._0_8_ = 0x7f0000007f;
          auVar16 = vpaddd_avx(auVar46,auVar45);
          auVar44._8_8_ = uStack_2ba8;
          auVar44._0_8_ = uStack_2bb0;
          auVar43._8_8_ = 0x7f0000007f;
          auVar43._0_8_ = 0x7f0000007f;
          auVar17 = vpaddd_avx(auVar44,auVar43);
          auVar16 = vpslld_avx(auVar16,ZEXT416(0x17));
          auVar17 = vpslld_avx(auVar17,ZEXT416(0x17));
          local_2680 = auVar16._0_4_;
          fStack_267c = auVar16._4_4_;
          fStack_2678 = auVar16._8_4_;
          fStack_2674 = auVar16._12_4_;
          fStack_2670 = auVar17._0_4_;
          fStack_266c = auVar17._4_4_;
          fStack_2668 = auVar17._8_4_;
          local_3860 = auVar14._0_4_;
          fStack_385c = auVar14._4_4_;
          fStack_3858 = auVar14._8_4_;
          fStack_3854 = auVar14._12_4_;
          fStack_3850 = auVar15._0_4_;
          fStack_384c = auVar15._4_4_;
          fStack_3848 = auVar15._8_4_;
          fStack_3844 = auVar15._12_4_;
          auVar32._16_8_ = uStack_34b0;
          auVar32._0_16_ = auVar14;
          auVar32._24_8_ = uStack_34a8;
          auVar31._4_4_ =
               fStack_385c +
               ((((((fStack_261c * 0.00019875691 + 0.0013981999) * fStack_261c + 0.008333452) *
                   fStack_261c + 0.041665796) * fStack_261c + 0.16666666) * fStack_261c + 0.5) *
                fStack_261c * fStack_261c + fStack_261c + 1.0) * fStack_267c;
          auVar31._0_4_ =
               local_3860 +
               ((((((local_2620 * 0.00019875691 + 0.0013981999) * local_2620 + 0.008333452) *
                   local_2620 + 0.041665796) * local_2620 + 0.16666666) * local_2620 + 0.5) *
                local_2620 * local_2620 + local_2620 + 1.0) * local_2680;
          auVar31._8_4_ =
               fStack_3858 +
               ((((((fStack_2618 * 0.00019875691 + 0.0013981999) * fStack_2618 + 0.008333452) *
                   fStack_2618 + 0.041665796) * fStack_2618 + 0.16666666) * fStack_2618 + 0.5) *
                fStack_2618 * fStack_2618 + fStack_2618 + 1.0) * fStack_2678;
          auVar31._12_4_ =
               fStack_3854 +
               ((((((fStack_2614 * 0.00019875691 + 0.0013981999) * fStack_2614 + 0.008333452) *
                   fStack_2614 + 0.041665796) * fStack_2614 + 0.16666666) * fStack_2614 + 0.5) *
                fStack_2614 * fStack_2614 + fStack_2614 + 1.0) * fStack_2674;
          auVar31._16_4_ =
               fStack_3850 +
               ((((((fStack_2610 * 0.00019875691 + 0.0013981999) * fStack_2610 + 0.008333452) *
                   fStack_2610 + 0.041665796) * fStack_2610 + 0.16666666) * fStack_2610 + 0.5) *
                fStack_2610 * fStack_2610 + fStack_2610 + 1.0) * fStack_2670;
          auVar31._20_4_ =
               fStack_384c +
               ((((((fStack_260c * 0.00019875691 + 0.0013981999) * fStack_260c + 0.008333452) *
                   fStack_260c + 0.041665796) * fStack_260c + 0.16666666) * fStack_260c + 0.5) *
                fStack_260c * fStack_260c + fStack_260c + 1.0) * fStack_266c;
          auVar31._24_4_ =
               fStack_3848 +
               ((((((fStack_2608 * 0.00019875691 + 0.0013981999) * fStack_2608 + 0.008333452) *
                   fStack_2608 + 0.041665796) * fStack_2608 + 0.16666666) * fStack_2608 + 0.5) *
                fStack_2608 * fStack_2608 + fStack_2608 + 1.0) * fStack_2668;
          auVar31._28_4_ = fStack_3844 + fStack_2604 + fStack_2604 + 1.0;
          _local_3e20 = vdivps_avx(auVar32,auVar31);
          break;
        case 5:
          local_3220._8_8_ = uStack_47f8;
          local_3220._0_8_ = local_4800;
          auVar33._16_8_ = uStack_47f0;
          auVar33._0_16_ = local_3220;
          auVar33._24_8_ = uStack_47e8;
          auVar22._8_8_ = 0x42b0c0a542b0c0a5;
          auVar22._0_8_ = 0x42b0c0a542b0c0a5;
          auVar22._16_8_ = 0x42b0c0a542b0c0a5;
          auVar22._24_8_ = 0x42b0c0a542b0c0a5;
          auVar21 = vminps_avx(auVar33,auVar22);
          auVar23._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar23._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar23._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar20 = vmaxps_avx(auVar21,auVar23);
          local_2ee0 = auVar20._0_4_;
          fStack_2edc = auVar20._4_4_;
          fStack_2ed8 = auVar20._8_4_;
          fStack_2ed4 = auVar20._12_4_;
          fStack_2ed0 = auVar20._16_4_;
          fStack_2ecc = auVar20._20_4_;
          fStack_2ec8 = auVar20._24_4_;
          local_3260._4_4_ = fStack_2edc * 1.442695 + 0.5;
          local_3260._0_4_ = local_2ee0 * 1.442695 + 0.5;
          fStack_3258 = fStack_2ed8 * 1.442695 + 0.5;
          fStack_3254 = fStack_2ed4 * 1.442695 + 0.5;
          fStack_3250 = fStack_2ed0 * 1.442695 + 0.5;
          fStack_324c = fStack_2ecc * 1.442695 + 0.5;
          fStack_3248 = fStack_2ec8 * 1.442695 + 0.5;
          uStack_3244 = 0x3ff8aa3b;
          auVar23 = vroundps_avx(_local_3260,1);
          auVar21 = vcmpps_avx(_local_3260,auVar23,1);
          auVar38._8_8_ = 0x3f8000003f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar38._16_8_ = 0x3f8000003f800000;
          auVar38._24_8_ = 0x3f8000003f800000;
          auVar21 = vandps_avx(auVar21,auVar38);
          auVar21 = vsubps_avx(auVar23,auVar21);
          local_2220 = auVar21._0_4_;
          fStack_221c = auVar21._4_4_;
          fStack_2218 = auVar21._8_4_;
          fStack_2214 = auVar21._12_4_;
          fStack_2210 = auVar21._16_4_;
          fStack_220c = auVar21._20_4_;
          fStack_2208 = auVar21._24_4_;
          fStack_2204 = auVar21._28_4_;
          auVar42._4_4_ = fStack_221c * 0.6933594;
          auVar42._0_4_ = local_2220 * 0.6933594;
          auVar42._8_4_ = fStack_2218 * 0.6933594;
          auVar42._12_4_ = fStack_2214 * 0.6933594;
          auVar42._16_4_ = fStack_2210 * 0.6933594;
          auVar42._20_4_ = fStack_220c * 0.6933594;
          auVar42._24_4_ = fStack_2208 * 0.6933594;
          auVar42._28_4_ = fStack_2204;
          auVar21 = vsubps_avx(auVar20,auVar42);
          auVar41._4_4_ = fStack_221c * -0.00021219444;
          auVar41._0_4_ = local_2220 * -0.00021219444;
          auVar41._8_4_ = fStack_2218 * -0.00021219444;
          auVar41._12_4_ = fStack_2214 * -0.00021219444;
          auVar41._16_4_ = fStack_2210 * -0.00021219444;
          auVar41._20_4_ = fStack_220c * -0.00021219444;
          auVar41._24_4_ = fStack_2208 * -0.00021219444;
          auVar41._28_4_ = fStack_2204;
          auVar21 = vsubps_avx(auVar21,auVar41);
          local_2ce0 = auVar21._0_4_;
          fStack_2cdc = auVar21._4_4_;
          fStack_2cd8 = auVar21._8_4_;
          fStack_2cd4 = auVar21._12_4_;
          fStack_2cd0 = auVar21._16_4_;
          fStack_2ccc = auVar21._20_4_;
          fStack_2cc8 = auVar21._24_4_;
          fStack_2cc4 = auVar21._28_4_;
          local_3280 = CONCAT44((int)fStack_221c,(int)local_2220);
          uStack_3278 = CONCAT44((int)fStack_2214,(int)fStack_2218);
          uStack_3270 = CONCAT44((int)fStack_220c,(int)fStack_2210);
          uStack_3268 = CONCAT44((int)fStack_2204,(int)fStack_2208);
          auVar17._8_8_ = uStack_3278;
          auVar17._0_8_ = local_3280;
          auVar14._8_8_ = 0x7f0000007f;
          auVar14._0_8_ = 0x7f0000007f;
          auVar14 = vpaddd_avx(auVar17,auVar14);
          auVar16._8_8_ = uStack_3268;
          auVar16._0_8_ = uStack_3270;
          auVar15._8_8_ = 0x7f0000007f;
          auVar15._0_8_ = 0x7f0000007f;
          auVar15 = vpaddd_avx(auVar16,auVar15);
          auVar14 = vpslld_avx(auVar14,ZEXT416(0x17));
          auVar15 = vpslld_avx(auVar15,ZEXT416(0x17));
          local_2d40 = auVar14._0_4_;
          fStack_2d3c = auVar14._4_4_;
          fStack_2d38 = auVar14._8_4_;
          fStack_2d34 = auVar14._12_4_;
          fStack_2d30 = auVar15._0_4_;
          fStack_2d2c = auVar15._4_4_;
          fStack_2d28 = auVar15._8_4_;
          auVar14 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x30);
          auVar15 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x30);
          local_3800 = auVar14._0_4_;
          fStack_37fc = auVar14._4_4_;
          fStack_37f8 = auVar14._8_4_;
          fStack_37f4 = auVar14._12_4_;
          fStack_37f0 = auVar15._0_4_;
          fStack_37ec = auVar15._4_4_;
          fStack_37e8 = auVar15._8_4_;
          fStack_37e4 = auVar15._12_4_;
          local_d80._4_4_ =
               ((((((fStack_2cdc * 0.00019875691 + 0.0013981999) * fStack_2cdc + 0.008333452) *
                   fStack_2cdc + 0.041665796) * fStack_2cdc + 0.16666666) * fStack_2cdc + 0.5) *
                fStack_2cdc * fStack_2cdc + fStack_2cdc + 1.0) * fStack_2d3c + fStack_37fc;
          local_d80._0_4_ =
               ((((((local_2ce0 * 0.00019875691 + 0.0013981999) * local_2ce0 + 0.008333452) *
                   local_2ce0 + 0.041665796) * local_2ce0 + 0.16666666) * local_2ce0 + 0.5) *
                local_2ce0 * local_2ce0 + local_2ce0 + 1.0) * local_2d40 + local_3800;
          fStack_d78 = ((((((fStack_2cd8 * 0.00019875691 + 0.0013981999) * fStack_2cd8 + 0.008333452
                           ) * fStack_2cd8 + 0.041665796) * fStack_2cd8 + 0.16666666) * fStack_2cd8
                        + 0.5) * fStack_2cd8 * fStack_2cd8 + fStack_2cd8 + 1.0) * fStack_2d38 +
                       fStack_37f8;
          fStack_d74 = ((((((fStack_2cd4 * 0.00019875691 + 0.0013981999) * fStack_2cd4 + 0.008333452
                           ) * fStack_2cd4 + 0.041665796) * fStack_2cd4 + 0.16666666) * fStack_2cd4
                        + 0.5) * fStack_2cd4 * fStack_2cd4 + fStack_2cd4 + 1.0) * fStack_2d34 +
                       fStack_37f4;
          uStack_d70._0_4_ =
               ((((((fStack_2cd0 * 0.00019875691 + 0.0013981999) * fStack_2cd0 + 0.008333452) *
                   fStack_2cd0 + 0.041665796) * fStack_2cd0 + 0.16666666) * fStack_2cd0 + 0.5) *
                fStack_2cd0 * fStack_2cd0 + fStack_2cd0 + 1.0) * fStack_2d30 + fStack_37f0;
          uStack_d70._4_4_ =
               ((((((fStack_2ccc * 0.00019875691 + 0.0013981999) * fStack_2ccc + 0.008333452) *
                   fStack_2ccc + 0.041665796) * fStack_2ccc + 0.16666666) * fStack_2ccc + 0.5) *
                fStack_2ccc * fStack_2ccc + fStack_2ccc + 1.0) * fStack_2d2c + fStack_37ec;
          uStack_d68._0_4_ =
               ((((((fStack_2cc8 * 0.00019875691 + 0.0013981999) * fStack_2cc8 + 0.008333452) *
                   fStack_2cc8 + 0.041665796) * fStack_2cc8 + 0.16666666) * fStack_2cc8 + 0.5) *
                fStack_2cc8 * fStack_2cc8 + fStack_2cc8 + 1.0) * fStack_2d28 + fStack_37e8;
          uStack_d68._4_4_ = fStack_2cc4 + fStack_2cc4 + 1.0 + fStack_37e4;
          auVar21 = _local_d80;
          auVar23 = vcmpps_avx(_local_d80,ZEXT1632(ZEXT816(0) << 0x40),2);
          uStack_d68 = auVar21._24_8_;
          auVar60._16_8_ = uStack_d70;
          auVar60._0_16_ = _local_d80;
          auVar60._24_8_ = uStack_d68;
          auVar59._8_8_ = 0x80000000800000;
          auVar59._0_8_ = 0x80000000800000;
          auVar59._16_8_ = 0x80000000800000;
          auVar59._24_8_ = 0x80000000800000;
          auVar21 = vmaxps_avx(auVar60,auVar59);
          auVar14 = vpsrld_avx(auVar21._0_16_,ZEXT416(0x17));
          auVar15 = vpsrld_avx(auVar21._16_16_,ZEXT416(0x17));
          auVar64._8_8_ = 0x807fffff807fffff;
          auVar64._0_8_ = 0x807fffff807fffff;
          auVar64._16_8_ = 0x807fffff807fffff;
          auVar64._24_8_ = 0x807fffff807fffff;
          auVar21 = vandps_avx(auVar21,auVar64);
          auVar67._8_8_ = 0x3f0000003f000000;
          auVar67._0_8_ = 0x3f0000003f000000;
          auVar67._16_8_ = 0x3f0000003f000000;
          auVar67._24_8_ = 0x3f0000003f000000;
          auVar22 = vorps_avx(auVar21,auVar67);
          auVar70._8_8_ = 0x7f0000007f;
          auVar70._0_8_ = 0x7f0000007f;
          auVar14 = vpsubd_avx(auVar14,auVar70);
          auVar69._8_8_ = 0x7f0000007f;
          auVar69._0_8_ = 0x7f0000007f;
          auVar15 = vpsubd_avx(auVar15,auVar69);
          local_160 = auVar15._0_8_;
          uStack_158 = auVar15._8_8_;
          auVar68._16_8_ = local_160;
          auVar68._0_16_ = auVar14;
          auVar68._24_8_ = uStack_158;
          auVar21 = vcvtdq2ps_avx(auVar68);
          local_ca0 = auVar21._0_4_;
          fStack_c9c = auVar21._4_4_;
          fStack_c98 = auVar21._8_4_;
          fStack_c94 = auVar21._12_4_;
          fStack_c90 = auVar21._16_4_;
          fStack_c8c = auVar21._20_4_;
          fStack_c88 = auVar21._24_4_;
          fStack_c84 = auVar21._28_4_;
          local_e00._4_4_ = fStack_c9c + 1.0;
          local_e00._0_4_ = local_ca0 + 1.0;
          fStack_df8 = fStack_c98 + 1.0;
          fStack_df4 = fStack_c94 + 1.0;
          uStack_df0._0_4_ = fStack_c90 + 1.0;
          uStack_df0._4_4_ = fStack_c8c + 1.0;
          uStack_de8._0_4_ = fStack_c88 + 1.0;
          uStack_de8._4_4_ = fStack_c84 + 1.0;
          auVar33 = _local_e00;
          auVar20 = vcmpps_avx(auVar22,_DAT_01f8f6e0,1);
          auVar21 = vandps_avx(auVar22,auVar20);
          auVar62._8_8_ = 0x3f8000003f800000;
          auVar62._0_8_ = 0x3f8000003f800000;
          auVar62._16_8_ = 0x3f8000003f800000;
          auVar62._24_8_ = 0x3f8000003f800000;
          auVar22 = vsubps_avx(auVar22,auVar62);
          uStack_de8 = auVar33._24_8_;
          auVar63._8_8_ = 0x3f8000003f800000;
          auVar63._0_8_ = 0x3f8000003f800000;
          auVar63._16_8_ = 0x3f8000003f800000;
          auVar63._24_8_ = 0x3f8000003f800000;
          auVar20 = vandps_avx(auVar20,auVar63);
          auVar61._16_8_ = uStack_df0;
          auVar61._0_16_ = _local_e00;
          auVar61._24_8_ = uStack_de8;
          auVar20 = vsubps_avx(auVar61,auVar20);
          local_ce0 = auVar22._0_4_;
          fStack_cdc = auVar22._4_4_;
          fStack_cd8 = auVar22._8_4_;
          fStack_cd4 = auVar22._12_4_;
          fStack_cd0 = auVar22._16_4_;
          fStack_ccc = auVar22._20_4_;
          fStack_cc8 = auVar22._24_4_;
          fStack_cc4 = auVar22._28_4_;
          local_d00 = auVar21._0_4_;
          fStack_cfc = auVar21._4_4_;
          fStack_cf8 = auVar21._8_4_;
          fStack_cf4 = auVar21._12_4_;
          fStack_cf0 = auVar21._16_4_;
          fStack_cec = auVar21._20_4_;
          fStack_ce8 = auVar21._24_4_;
          fStack_ce4 = auVar21._28_4_;
          local_ce0 = local_ce0 + local_d00;
          fStack_cdc = fStack_cdc + fStack_cfc;
          fStack_cd8 = fStack_cd8 + fStack_cf8;
          fStack_cd4 = fStack_cd4 + fStack_cf4;
          fStack_cd0 = fStack_cd0 + fStack_cf0;
          fStack_ccc = fStack_ccc + fStack_cec;
          fStack_cc8 = fStack_cc8 + fStack_ce8;
          fStack_cc4 = fStack_cc4 + fStack_ce4;
          local_6a0 = auVar20._0_4_;
          fStack_69c = auVar20._4_4_;
          fStack_698 = auVar20._8_4_;
          fStack_694 = auVar20._12_4_;
          fStack_690 = auVar20._16_4_;
          fStack_68c = auVar20._20_4_;
          fStack_688 = auVar20._24_4_;
          local_e80._4_4_ =
               fStack_69c * -0.00021219444 +
               ((((((((fStack_cdc * 0.070376836 + -0.1151461) * fStack_cdc + 0.116769984) *
                     fStack_cdc + -0.12420141) * fStack_cdc + 0.14249323) * fStack_cdc + -0.16668057
                  ) * fStack_cdc + 0.20000714) * fStack_cdc + -0.24999994) * fStack_cdc + 0.3333333)
               * fStack_cdc * fStack_cdc * fStack_cdc;
          local_e80._0_4_ =
               local_6a0 * -0.00021219444 +
               ((((((((local_ce0 * 0.070376836 + -0.1151461) * local_ce0 + 0.116769984) * local_ce0
                    + -0.12420141) * local_ce0 + 0.14249323) * local_ce0 + -0.16668057) * local_ce0
                 + 0.20000714) * local_ce0 + -0.24999994) * local_ce0 + 0.3333333) * local_ce0 *
               local_ce0 * local_ce0;
          fStack_e78 = fStack_698 * -0.00021219444 +
                       ((((((((fStack_cd8 * 0.070376836 + -0.1151461) * fStack_cd8 + 0.116769984) *
                             fStack_cd8 + -0.12420141) * fStack_cd8 + 0.14249323) * fStack_cd8 +
                          -0.16668057) * fStack_cd8 + 0.20000714) * fStack_cd8 + -0.24999994) *
                        fStack_cd8 + 0.3333333) * fStack_cd8 * fStack_cd8 * fStack_cd8;
          fStack_e74 = fStack_694 * -0.00021219444 +
                       ((((((((fStack_cd4 * 0.070376836 + -0.1151461) * fStack_cd4 + 0.116769984) *
                             fStack_cd4 + -0.12420141) * fStack_cd4 + 0.14249323) * fStack_cd4 +
                          -0.16668057) * fStack_cd4 + 0.20000714) * fStack_cd4 + -0.24999994) *
                        fStack_cd4 + 0.3333333) * fStack_cd4 * fStack_cd4 * fStack_cd4;
          fStack_e70 = fStack_690 * -0.00021219444 +
                       ((((((((fStack_cd0 * 0.070376836 + -0.1151461) * fStack_cd0 + 0.116769984) *
                             fStack_cd0 + -0.12420141) * fStack_cd0 + 0.14249323) * fStack_cd0 +
                          -0.16668057) * fStack_cd0 + 0.20000714) * fStack_cd0 + -0.24999994) *
                        fStack_cd0 + 0.3333333) * fStack_cd0 * fStack_cd0 * fStack_cd0;
          fStack_e6c = fStack_68c * -0.00021219444 +
                       ((((((((fStack_ccc * 0.070376836 + -0.1151461) * fStack_ccc + 0.116769984) *
                             fStack_ccc + -0.12420141) * fStack_ccc + 0.14249323) * fStack_ccc +
                          -0.16668057) * fStack_ccc + 0.20000714) * fStack_ccc + -0.24999994) *
                        fStack_ccc + 0.3333333) * fStack_ccc * fStack_ccc * fStack_ccc;
          fStack_e68 = fStack_688 * -0.00021219444 +
                       ((((((((fStack_cc8 * 0.070376836 + -0.1151461) * fStack_cc8 + 0.116769984) *
                             fStack_cc8 + -0.12420141) * fStack_cc8 + 0.14249323) * fStack_cc8 +
                          -0.16668057) * fStack_cc8 + 0.20000714) * fStack_cc8 + -0.24999994) *
                        fStack_cc8 + 0.3333333) * fStack_cc8 * fStack_cc8 * fStack_cc8;
          fStack_e64 = fStack_cc4 + 0.3333333 + -0.00021219444;
          auVar65._4_4_ = fStack_cdc * fStack_cdc * 0.5;
          auVar65._0_4_ = local_ce0 * local_ce0 * 0.5;
          auVar65._8_4_ = fStack_cd8 * fStack_cd8 * 0.5;
          auVar65._12_4_ = fStack_cd4 * fStack_cd4 * 0.5;
          auVar65._16_4_ = fStack_cd0 * fStack_cd0 * 0.5;
          auVar65._20_4_ = fStack_ccc * fStack_ccc * 0.5;
          auVar65._24_4_ = fStack_cc8 * fStack_cc8 * 0.5;
          auVar65._28_4_ = fStack_cc4;
          auVar21 = vsubps_avx(_local_e80,auVar65);
          local_d40 = auVar21._0_4_;
          fStack_d3c = auVar21._4_4_;
          fStack_d38 = auVar21._8_4_;
          fStack_d34 = auVar21._12_4_;
          fStack_d30 = auVar21._16_4_;
          fStack_d2c = auVar21._20_4_;
          fStack_d28 = auVar21._24_4_;
          fStack_d24 = auVar21._28_4_;
          local_d80._4_4_ = fStack_69c * 0.6933594 + fStack_cdc + fStack_d3c;
          local_d80._0_4_ = local_6a0 * 0.6933594 + local_ce0 + local_d40;
          fStack_d78 = fStack_698 * 0.6933594 + fStack_cd8 + fStack_d38;
          fStack_d74 = fStack_694 * 0.6933594 + fStack_cd4 + fStack_d34;
          uStack_d70._0_4_ = fStack_690 * 0.6933594 + fStack_cd0 + fStack_d30;
          uStack_d70._4_4_ = fStack_68c * 0.6933594 + fStack_ccc + fStack_d2c;
          uStack_d68._0_4_ = fStack_688 * 0.6933594 + fStack_cc8 + fStack_d28;
          uStack_d68._4_4_ = fStack_cc4 + fStack_d24 + 0.6933594;
          auVar21 = _local_d80;
          uStack_d68 = auVar21._24_8_;
          auVar66._16_8_ = uStack_d70;
          auVar66._0_16_ = _local_d80;
          auVar66._24_8_ = uStack_d68;
          auVar21 = vorps_avx(auVar66,auVar23);
          auVar14 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x30);
          auVar15 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x30);
          uStack_1ab0 = auVar15._0_8_;
          uStack_1aa8 = auVar15._8_8_;
          auVar15 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40000000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40000000),0x30);
          auVar16 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40000000),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40000000),0x30);
          local_1c00 = auVar21._0_4_;
          fStack_1bfc = auVar21._4_4_;
          fStack_1bf8 = auVar21._8_4_;
          fStack_1bf4 = auVar21._12_4_;
          fStack_1bf0 = auVar21._16_4_;
          fStack_1bec = auVar21._20_4_;
          fStack_1be8 = auVar21._24_4_;
          uStack_1be4 = auVar21._28_4_;
          local_1c20 = auVar15._0_4_;
          fStack_1c1c = auVar15._4_4_;
          fStack_1c18 = auVar15._8_4_;
          fStack_1c14 = auVar15._12_4_;
          fStack_1c10 = auVar16._0_4_;
          fStack_1c0c = auVar16._4_4_;
          fStack_1c08 = auVar16._8_4_;
          auVar15 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x30);
          auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
          uStack_1af0 = auVar16._0_8_;
          uStack_1ae8 = auVar16._8_8_;
          auVar51._4_4_ = fStack_1bfc * fStack_1c1c;
          auVar51._0_4_ = local_1c00 * local_1c20;
          auVar51._12_4_ = fStack_1bf4 * fStack_1c14;
          auVar51._8_4_ = fStack_1bf8 * fStack_1c18;
          auVar51._20_4_ = fStack_1bec * fStack_1c0c;
          auVar51._16_4_ = fStack_1bf0 * fStack_1c10;
          auVar51._28_4_ = uStack_1be4;
          auVar51._24_4_ = fStack_1be8 * fStack_1c08;
          auVar21 = vsubps_avx(ZEXT832(0),auVar51);
          auVar50._8_8_ = 0x42b0c0a542b0c0a5;
          auVar50._0_8_ = 0x42b0c0a542b0c0a5;
          auVar50._16_8_ = 0x42b0c0a542b0c0a5;
          auVar50._24_8_ = 0x42b0c0a542b0c0a5;
          auVar21 = vminps_avx(auVar21,auVar50);
          auVar49._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar49._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar49._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar49._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar20 = vmaxps_avx(auVar21,auVar49);
          local_15e0 = auVar20._0_4_;
          fStack_15dc = auVar20._4_4_;
          fStack_15d8 = auVar20._8_4_;
          fStack_15d4 = auVar20._12_4_;
          fStack_15d0 = auVar20._16_4_;
          fStack_15cc = auVar20._20_4_;
          fStack_15c8 = auVar20._24_4_;
          local_1960._4_4_ = fStack_15dc * 1.442695 + 0.5;
          local_1960._0_4_ = local_15e0 * 1.442695 + 0.5;
          fStack_1958 = fStack_15d8 * 1.442695 + 0.5;
          fStack_1954 = fStack_15d4 * 1.442695 + 0.5;
          fStack_1950 = fStack_15d0 * 1.442695 + 0.5;
          fStack_194c = fStack_15cc * 1.442695 + 0.5;
          fStack_1948 = fStack_15c8 * 1.442695 + 0.5;
          uStack_1944 = 0x3ff8aa3b;
          auVar23 = vroundps_avx(_local_1960,1);
          auVar21 = vcmpps_avx(_local_1960,auVar23,1);
          auVar54._8_8_ = 0x3f8000003f800000;
          auVar54._0_8_ = 0x3f8000003f800000;
          auVar54._16_8_ = 0x3f8000003f800000;
          auVar54._24_8_ = 0x3f8000003f800000;
          auVar21 = vandps_avx(auVar21,auVar54);
          auVar21 = vsubps_avx(auVar23,auVar21);
          local_1160 = auVar21._0_4_;
          fStack_115c = auVar21._4_4_;
          fStack_1158 = auVar21._8_4_;
          fStack_1154 = auVar21._12_4_;
          fStack_1150 = auVar21._16_4_;
          fStack_114c = auVar21._20_4_;
          fStack_1148 = auVar21._24_4_;
          fStack_1144 = auVar21._28_4_;
          auVar56._4_4_ = fStack_115c * 0.6933594;
          auVar56._0_4_ = local_1160 * 0.6933594;
          auVar56._8_4_ = fStack_1158 * 0.6933594;
          auVar56._12_4_ = fStack_1154 * 0.6933594;
          auVar56._16_4_ = fStack_1150 * 0.6933594;
          auVar56._20_4_ = fStack_114c * 0.6933594;
          auVar56._24_4_ = fStack_1148 * 0.6933594;
          auVar56._28_4_ = fStack_1144;
          auVar21 = vsubps_avx(auVar20,auVar56);
          auVar55._4_4_ = fStack_115c * -0.00021219444;
          auVar55._0_4_ = local_1160 * -0.00021219444;
          auVar55._8_4_ = fStack_1158 * -0.00021219444;
          auVar55._12_4_ = fStack_1154 * -0.00021219444;
          auVar55._16_4_ = fStack_1150 * -0.00021219444;
          auVar55._20_4_ = fStack_114c * -0.00021219444;
          auVar55._24_4_ = fStack_1148 * -0.00021219444;
          auVar55._28_4_ = fStack_1144;
          auVar21 = vsubps_avx(auVar21,auVar55);
          local_13e0 = auVar21._0_4_;
          fStack_13dc = auVar21._4_4_;
          fStack_13d8 = auVar21._8_4_;
          fStack_13d4 = auVar21._12_4_;
          fStack_13d0 = auVar21._16_4_;
          fStack_13cc = auVar21._20_4_;
          fStack_13c8 = auVar21._24_4_;
          fStack_13c4 = auVar21._28_4_;
          local_1980 = CONCAT44((int)fStack_115c,(int)local_1160);
          uStack_1978 = CONCAT44((int)fStack_1154,(int)fStack_1158);
          uStack_1970 = CONCAT44((int)fStack_114c,(int)fStack_1150);
          uStack_1968 = CONCAT44((int)fStack_1144,(int)fStack_1148);
          auVar58._8_8_ = uStack_1978;
          auVar58._0_8_ = local_1980;
          auVar57._8_8_ = 0x7f0000007f;
          auVar57._0_8_ = 0x7f0000007f;
          auVar17 = vpaddd_avx(auVar58,auVar57);
          auVar19._8_8_ = uStack_1968;
          auVar19._0_8_ = uStack_1970;
          auVar18._8_8_ = 0x7f0000007f;
          auVar18._0_8_ = 0x7f0000007f;
          auVar18 = vpaddd_avx(auVar19,auVar18);
          auVar17 = vpslld_avx(auVar17,ZEXT416(0x17));
          auVar18 = vpslld_avx(auVar18,ZEXT416(0x17));
          local_1440 = auVar17._0_4_;
          fStack_143c = auVar17._4_4_;
          fStack_1438 = auVar17._8_4_;
          fStack_1434 = auVar17._12_4_;
          fStack_1430 = auVar18._0_4_;
          fStack_142c = auVar18._4_4_;
          fStack_1428 = auVar18._8_4_;
          local_1b40 = auVar15._0_4_;
          fStack_1b3c = auVar15._4_4_;
          fStack_1b38 = auVar15._8_4_;
          fStack_1b34 = auVar15._12_4_;
          fStack_1b30 = auVar16._0_4_;
          fStack_1b2c = auVar16._4_4_;
          fStack_1b28 = auVar16._8_4_;
          fStack_1b24 = auVar16._12_4_;
          auVar48._16_8_ = uStack_1af0;
          auVar48._0_16_ = auVar15;
          auVar48._24_8_ = uStack_1ae8;
          auVar47._4_4_ =
               fStack_1b3c +
               ((((((fStack_13dc * 0.00019875691 + 0.0013981999) * fStack_13dc + 0.008333452) *
                   fStack_13dc + 0.041665796) * fStack_13dc + 0.16666666) * fStack_13dc + 0.5) *
                fStack_13dc * fStack_13dc + fStack_13dc + 1.0) * fStack_143c;
          auVar47._0_4_ =
               local_1b40 +
               ((((((local_13e0 * 0.00019875691 + 0.0013981999) * local_13e0 + 0.008333452) *
                   local_13e0 + 0.041665796) * local_13e0 + 0.16666666) * local_13e0 + 0.5) *
                local_13e0 * local_13e0 + local_13e0 + 1.0) * local_1440;
          auVar47._8_4_ =
               fStack_1b38 +
               ((((((fStack_13d8 * 0.00019875691 + 0.0013981999) * fStack_13d8 + 0.008333452) *
                   fStack_13d8 + 0.041665796) * fStack_13d8 + 0.16666666) * fStack_13d8 + 0.5) *
                fStack_13d8 * fStack_13d8 + fStack_13d8 + 1.0) * fStack_1438;
          auVar47._12_4_ =
               fStack_1b34 +
               ((((((fStack_13d4 * 0.00019875691 + 0.0013981999) * fStack_13d4 + 0.008333452) *
                   fStack_13d4 + 0.041665796) * fStack_13d4 + 0.16666666) * fStack_13d4 + 0.5) *
                fStack_13d4 * fStack_13d4 + fStack_13d4 + 1.0) * fStack_1434;
          auVar47._16_4_ =
               fStack_1b30 +
               ((((((fStack_13d0 * 0.00019875691 + 0.0013981999) * fStack_13d0 + 0.008333452) *
                   fStack_13d0 + 0.041665796) * fStack_13d0 + 0.16666666) * fStack_13d0 + 0.5) *
                fStack_13d0 * fStack_13d0 + fStack_13d0 + 1.0) * fStack_1430;
          auVar47._20_4_ =
               fStack_1b2c +
               ((((((fStack_13cc * 0.00019875691 + 0.0013981999) * fStack_13cc + 0.008333452) *
                   fStack_13cc + 0.041665796) * fStack_13cc + 0.16666666) * fStack_13cc + 0.5) *
                fStack_13cc * fStack_13cc + fStack_13cc + 1.0) * fStack_142c;
          auVar47._24_4_ =
               fStack_1b28 +
               ((((((fStack_13c8 * 0.00019875691 + 0.0013981999) * fStack_13c8 + 0.008333452) *
                   fStack_13c8 + 0.041665796) * fStack_13c8 + 0.16666666) * fStack_13c8 + 0.5) *
                fStack_13c8 * fStack_13c8 + fStack_13c8 + 1.0) * fStack_1428;
          auVar47._28_4_ = fStack_1b24 + fStack_13c4 + fStack_13c4 + 1.0;
          auVar21 = vdivps_avx(auVar48,auVar47);
          local_1c40 = auVar21._0_4_;
          fStack_1c3c = auVar21._4_4_;
          fStack_1c38 = auVar21._8_4_;
          fStack_1c34 = auVar21._12_4_;
          fStack_1c30 = auVar21._16_4_;
          fStack_1c2c = auVar21._20_4_;
          fStack_1c28 = auVar21._24_4_;
          auVar53._4_4_ = fStack_1c3c * fStack_1c1c;
          auVar53._0_4_ = local_1c40 * local_1c20;
          auVar53._8_4_ = fStack_1c38 * fStack_1c18;
          auVar53._12_4_ = fStack_1c34 * fStack_1c14;
          auVar53._16_4_ = fStack_1c30 * fStack_1c10;
          auVar53._20_4_ = fStack_1c2c * fStack_1c0c;
          auVar53._24_4_ = fStack_1c28 * fStack_1c08;
          auVar53._28_4_ = auVar21._28_4_;
          auVar52._16_8_ = uStack_1ab0;
          auVar52._0_16_ = auVar14;
          auVar52._24_8_ = uStack_1aa8;
          auVar21 = vsubps_avx(auVar53,auVar52);
          uStack_3784 = (undefined4)((ulong)uStack_47e8 >> 0x20);
          local_37c0 = auVar21._0_4_;
          fStack_37bc = auVar21._4_4_;
          fStack_37b8 = auVar21._8_4_;
          fStack_37b4 = auVar21._12_4_;
          fStack_37b0 = auVar21._16_4_;
          fStack_37ac = auVar21._20_4_;
          fStack_37a8 = auVar21._24_4_;
          local_3e20._4_4_ = fStack_379c * fStack_37bc;
          local_3e20._0_4_ = local_37a0 * local_37c0;
          uStack_3e18._0_4_ = fStack_3798 * fStack_37b8;
          uStack_3e18._4_4_ = fStack_3794 * fStack_37b4;
          uStack_3e10._0_4_ = fStack_3790 * fStack_37b0;
          uStack_3e10._4_4_ = fStack_378c * fStack_37ac;
          uStack_3e08._0_4_ = fStack_3788 * fStack_37a8;
          uStack_3e08._4_4_ = uStack_3784;
          break;
        case 6:
          uVar10 = *(uint *)*plVar24;
          auVar14 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar10),0x30);
          auVar15 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(uVar10),0x30);
          uVar10 = *(uint *)(*plVar24 + 4);
          auVar16 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(uVar10),0x20);
          auVar16 = vinsertps_avx(auVar16,ZEXT416(uVar10),0x30);
          auVar17 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(uVar10),0x20);
          auVar17 = vinsertps_avx(auVar17,ZEXT416(uVar10),0x30);
          auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
          auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
          auVar19 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x20);
          auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x30);
          uStack_3530 = auVar19._0_8_;
          uStack_3528 = auVar19._8_8_;
          local_3660 = auVar14._0_4_;
          fStack_365c = auVar14._4_4_;
          fStack_3658 = auVar14._8_4_;
          fStack_3654 = auVar14._12_4_;
          fStack_3650 = auVar15._0_4_;
          fStack_364c = auVar15._4_4_;
          fStack_3648 = auVar15._8_4_;
          fStack_3644 = auVar15._12_4_;
          local_36a0 = auVar16._0_4_;
          fStack_369c = auVar16._4_4_;
          fStack_3698 = auVar16._8_4_;
          fStack_3694 = auVar16._12_4_;
          fStack_3690 = auVar17._0_4_;
          fStack_368c = auVar17._4_4_;
          fStack_3688 = auVar17._8_4_;
          fStack_3684 = auVar17._12_4_;
          local_3740._4_4_ = fStack_379c * fStack_365c + fStack_369c;
          local_3740._0_4_ = local_37a0 * local_3660 + local_36a0;
          fStack_3738 = fStack_3798 * fStack_3658 + fStack_3698;
          fStack_3734 = fStack_3794 * fStack_3654 + fStack_3694;
          uStack_3730._0_4_ = fStack_3790 * fStack_3650 + fStack_3690;
          uStack_3730._4_4_ = fStack_378c * fStack_364c + fStack_368c;
          uStack_3728._0_4_ = fStack_3788 * fStack_3648 + fStack_3688;
          uStack_3728._4_4_ = fStack_3644 + fStack_3684;
          auVar21 = _local_3740;
          uStack_3728 = auVar21._24_8_;
          auVar21._16_8_ = uStack_3730;
          auVar21._0_16_ = _local_3740;
          auVar21._24_8_ = uStack_3728;
          auVar21 = vmaxps_avx(auVar21,ZEXT832(0));
          auVar20._16_8_ = uStack_3530;
          auVar20._0_16_ = auVar18;
          auVar20._24_8_ = uStack_3528;
          auVar21 = vminps_avx(auVar21,auVar20);
          local_3600 = auVar21._0_4_;
          fStack_35fc = auVar21._4_4_;
          fStack_35f8 = auVar21._8_4_;
          fStack_35f4 = auVar21._12_4_;
          fStack_35f0 = auVar21._16_4_;
          fStack_35ec = auVar21._20_4_;
          fStack_35e8 = auVar21._24_4_;
          uStack_35e4 = auVar21._28_4_;
          local_3e20._4_4_ = fStack_35fc * fStack_379c;
          local_3e20._0_4_ = local_3600 * local_37a0;
          uStack_3e18._0_4_ = fStack_35f8 * fStack_3798;
          uStack_3e18._4_4_ = fStack_35f4 * fStack_3794;
          uStack_3e10._0_4_ = fStack_35f0 * fStack_3790;
          uStack_3e10._4_4_ = fStack_35ec * fStack_378c;
          uStack_3e08._0_4_ = fStack_35e8 * fStack_3788;
          uStack_3e08._4_4_ = uStack_35e4;
          break;
        default:
          uStack_3e18 = uStack_47f8;
          local_3e20 = (undefined1  [8])local_4800;
          uStack_3e10 = uStack_47f0;
          uStack_3e08 = uStack_47e8;
        }
        *local_4758 = _local_3e20;
        local_4758 = local_4758 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _sum = _mm256_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm256_loadu_ps(bias_data_ptr + p * 8);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 8;

                            int k = (y * kernel_w + x) * 64;

                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);
                            __m256 _w0 = _mm256_load_ps(kptr + k);
                            __m256 _w1 = _mm256_load_ps(kptr + k + 8);
                            __m256 _w2 = _mm256_load_ps(kptr + k + 16);
                            __m256 _w3 = _mm256_load_ps(kptr + k + 24);
                            __m256 _w4 = _mm256_load_ps(kptr + k + 32);
                            __m256 _w5 = _mm256_load_ps(kptr + k + 40);
                            __m256 _w6 = _mm256_load_ps(kptr + k + 48);
                            __m256 _w7 = _mm256_load_ps(kptr + k + 56);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val4, _w4, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val5, _w5, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val6, _w6, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val7, _w7, _sum);
                        }
                    }

                    kptr += maxk * 64;
                }

                _sum = activation_avx(_sum, activation_type, activation_params);

                _mm256_storeu_ps(outptr, _sum);
                outptr += 8;
            }
        }
    }
}